

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_symbol_codec.cpp
# Opt level: O3

void __thiscall
lzham::quasi_adaptive_huffman_data_model::reset_update_rate(quasi_adaptive_huffman_data_model *this)

{
  unsigned_short *puVar1;
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  
  uVar5 = this->m_update_cycle;
  uVar4 = (uVar5 - this->m_symbols_until_update) + this->m_total_count;
  this->m_total_count = uVar4;
  if (this->m_total_syms < uVar4) {
    if (this->m_total_syms == 0) {
      uVar2 = 0;
    }
    else {
      uVar3 = 0;
      uVar2 = 0;
      do {
        puVar1 = (this->m_sym_freq).m_p;
        uVar5 = puVar1[uVar3] + 1 >> 1;
        uVar2 = uVar2 + uVar5;
        puVar1[uVar3] = (unsigned_short)uVar5;
        uVar3 = uVar3 + 1;
      } while (uVar3 < this->m_total_syms);
      uVar5 = this->m_update_cycle;
    }
    this->m_total_count = uVar2;
  }
  uVar4 = 8;
  if (uVar5 < 8) {
    uVar4 = uVar5;
  }
  this->m_update_cycle = uVar4;
  this->m_symbols_until_update = uVar4;
  return;
}

Assistant:

void quasi_adaptive_huffman_data_model::reset_update_rate()
   {
      m_total_count += (m_update_cycle - m_symbols_until_update);

#ifdef LZHAM_BUILD_DEBUG
      uint actual_total = 0;
      for (uint i = 0; i < m_sym_freq.size(); i++)
         actual_total += m_sym_freq[i];
      LZHAM_ASSERT(actual_total == m_total_count);
#endif

      if (m_total_count > m_total_syms)
         rescale();

      m_symbols_until_update = m_update_cycle = LZHAM_MIN(8, m_update_cycle);
   }